

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcxtexture.cpp
# Opt level: O3

void __thiscall FPCXTexture::FPCXTexture(FPCXTexture *this,int lumpnum,PCXHeader *hdr)

{
  undefined1 *puVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,lumpnum);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FPCXTexture_0088ca08;
  this->Pixels = (BYTE *)0x0;
  puVar1 = &(this->super_FTexture).field_0x31;
  *puVar1 = *puVar1 & 0xf7;
  uVar2 = hdr->xmax;
  uVar4 = hdr->ymax;
  uVar3 = hdr->xmin;
  uVar5 = hdr->ymin;
  (this->super_FTexture).Width = (uVar2 - uVar3) + 1;
  (this->super_FTexture).Height = (uVar4 - uVar5) + 1;
  FTexture::CalcBitSize(&this->super_FTexture);
  this->DummySpans[0].TopOffset = 0;
  this->DummySpans[0].Length = (this->super_FTexture).Height;
  this->DummySpans[1].TopOffset = 0;
  this->DummySpans[1].Length = 0;
  return;
}

Assistant:

FPCXTexture::FPCXTexture(int lumpnum, PCXHeader & hdr)
: FTexture(NULL, lumpnum), Pixels(0)
{
	bMasked = false;
	Width = LittleShort(hdr.xmax) - LittleShort(hdr.xmin) + 1;
	Height = LittleShort(hdr.ymax) - LittleShort(hdr.ymin) + 1;
	CalcBitSize();

	DummySpans[0].TopOffset = 0;
	DummySpans[0].Length = Height;
	DummySpans[1].TopOffset = 0;
	DummySpans[1].Length = 0;
}